

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::Impl::Impl
          (Impl *this,VatNetworkBase *network,Maybe<capnp::Capability::Client> *bootstrapInterface)

{
  PromiseArenaMember *node;
  SourceLocation location;
  SourceLocation location_00;
  PromiseBase node_00;
  undefined8 node_01;
  Refcounted *refcounted;
  RpcSystemBrand *pRVar1;
  PromiseBase local_68;
  undefined1 local_60 [48];
  BootstrapFactoryBase *local_30;
  
  (this->super_BootstrapFactoryBase)._vptr_BootstrapFactoryBase =
       (_func_int **)&PTR_baseCreateFor_006d0008;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_006d0028;
  this->network = network;
  kj::Maybe<capnp::Capability::Client>::Maybe(&this->bootstrapInterface,bootstrapInterface);
  this->bootstrapFactory = &this->super_BootstrapFactoryBase;
  this->flowLimit = 0xffffffffffffffff;
  (this->traceEncoder).ptr.isSet = false;
  (this->acceptLoopPromise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  pRVar1 = (RpcSystemBrand *)operator_new(0x10);
  (pRVar1->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(pRVar1->super_Refcounted).refcount = 0;
  (pRVar1->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006d0078
  ;
  (pRVar1->super_Refcounted).refcount = 1;
  (this->brand).disposer = (Disposer *)pRVar1;
  (this->brand).ptr = pRVar1;
  local_60._32_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  local_60._40_8_ = "Impl";
  local_30 = (BootstrapFactoryBase *)0x22000011a4;
  location.function = "Impl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  location.lineNumber = 0x11a4;
  location.columnNumber = 0x22;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler,location);
  (this->connections).table.rows.builder.ptr = (Entry *)0x0;
  (this->connections).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState>_>::Entry>
        *)0x0;
  (this->connections).table.rows.builder.endPtr = (Entry *)0x0;
  (this->connections).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->connections).table.indexes.erasedCount = 0;
  (this->connections).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->connections).table.indexes.buckets.size_ = 0;
  (this->connections).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  acceptLoop((Impl *)local_60);
  local_60._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  local_60._16_8_ = "Impl";
  local_60._24_8_ = 0x19000011a5;
  location_00.function = "Impl";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  location_00.lineNumber = 0x11a5;
  location_00.columnNumber = 0x19;
  kj::Promise<void>::
  eagerlyEvaluate<capnp::_::RpcSystemBase::Impl::Impl(capnp::_::VatNetworkBase&,kj::Maybe<capnp::Capability::Client>)::_lambda(kj::Exception&&)_1_>
            ((Promise<void> *)&local_68,(anon_class_1_0_00000001_for_errorHandler *)local_60,
             location_00);
  node = &((this->acceptLoopPromise).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  (this->acceptLoopPromise).super_PromiseBase.node.ptr = (PromiseNode *)local_68.node.ptr;
  local_68.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
    node_00.node.ptr = local_68.node.ptr;
    if (local_68.node.ptr != (PromiseNode *)0x0) {
      local_68.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.node.ptr);
    }
  }
  node_01 = local_60._0_8_;
  if ((PromiseArenaMember *)local_60._0_8_ != (PromiseArenaMember *)0x0) {
    local_60._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01);
  }
  return;
}

Assistant:

Impl(VatNetworkBase& network, kj::Maybe<Capability::Client> bootstrapInterface)
      : network(network), bootstrapInterface(kj::mv(bootstrapInterface)),
        bootstrapFactory(*this), tasks(*this) {
    acceptLoopPromise = acceptLoop().eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
  }